

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O0

void Msat_IntVecPush(Msat_IntVec_t *p,int Entry)

{
  int iVar1;
  int Entry_local;
  Msat_IntVec_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Msat_IntVecGrow(p,0x10);
    }
    else {
      Msat_IntVecGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Msat_IntVecPush( Msat_IntVec_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Msat_IntVecGrow( p, 16 );
        else
            Msat_IntVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}